

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugScreen.cpp
# Opt level: O2

void __thiscall DebugScreen::draw(DebugScreen *this,RenderTarget *target,RenderStates states)

{
  float fVar1;
  pointer pTVar2;
  int iVar3;
  Vector2f *pVVar4;
  Vector2u VVar5;
  Vector2u VVar6;
  int iVar7;
  Text *field;
  pointer drawable;
  pointer pNVar8;
  int iVar9;
  __node_base *p_Var10;
  float fVar11;
  int iVar12;
  float fVar13;
  locale local_3c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  string local_3a0;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  Sprite sprite;
  Text textureField;
  
  if (this->visible_ == true) {
    iVar3 = (this->borderTopLeft_).x;
    iVar7 = (this->windowSize_).x - (iVar3 + (this->borderBottomRight_).x);
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    iVar12 = (this->borderTopLeft_).y;
    iVar9 = (this->windowSize_).y - (iVar12 + (this->borderBottomRight_).y);
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    textureField.super_Drawable._vptr_Drawable = (_func_int **)CONCAT44((float)iVar12,(float)iVar3);
    sf::Transform::translate(&states.transform,(Vector2f *)&textureField);
    if (this->mode_ == textures) {
      std::locale::locale((locale *)&local_3c0);
      sf::String::String((String *)&sprite,"Texture: none",(locale *)&local_3c0);
      sf::Text::Text(&textureField,(String *)&sprite,this->font_,this->characterSize_);
      std::__cxx11::
      basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
      ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&sprite);
      std::locale::~locale((locale *)&local_3c0);
      pVVar4 = sf::Transformable::getPosition
                         (&((this->fields_).super__Vector_base<sf::Text,_std::allocator<sf::Text>_>.
                            _M_impl.super__Vector_impl_data._M_start)->super_Transformable);
      sprite.super_Drawable._vptr_Drawable =
           (_func_int **)CONCAT44((float)this->characterSize_ + (*pVVar4).y,(*pVVar4).x + 0.0);
      sf::Transformable::setPosition(&textureField.super_Transformable,(Vector2f *)&sprite);
      iVar3 = (this->modeStates_)._M_elems[(int)this->mode_];
      if (-1 < (long)iVar3) {
        pNVar8 = (this->textures_).
                 super__Vector_base<DebugScreen::NamedTexture,_std::allocator<DebugScreen::NamedTexture>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (iVar3 < (int)(((long)(this->textures_).
                                 super__Vector_base<DebugScreen::NamedTexture,_std::allocator<DebugScreen::NamedTexture>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar8) / 0x28))
        {
          pNVar8 = pNVar8 + iVar3;
          std::operator+(&local_360,"Texture: ",&pNVar8->name);
          std::operator+(&local_340,&local_360," (size ");
          VVar5 = sf::Texture::getSize(pNVar8->texture);
          std::__cxx11::to_string(&local_380,VVar5.x);
          std::operator+(&local_320,&local_340,&local_380);
          std::operator+(&local_300,&local_320," by ");
          VVar5 = sf::Texture::getSize(pNVar8->texture);
          std::__cxx11::to_string(&local_3a0,VVar5.y);
          std::operator+(&local_2e0,&local_300,&local_3a0);
          std::operator+(&local_3c0,&local_2e0,")");
          std::locale::locale(local_3c8);
          sf::String::String((String *)&sprite,&local_3c0,local_3c8);
          sf::Text::setString(&textureField,(String *)&sprite);
          std::__cxx11::
          basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&sprite);
          std::locale::~locale(local_3c8);
          std::__cxx11::string::~string((string *)&local_3c0);
          std::__cxx11::string::~string((string *)&local_2e0);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::~string((string *)&local_320);
          std::__cxx11::string::~string((string *)&local_380);
          std::__cxx11::string::~string((string *)&local_340);
          std::__cxx11::string::~string((string *)&local_360);
          sf::Sprite::Sprite(&sprite,pNVar8->texture);
          pVVar4 = sf::Transformable::getPosition(&textureField.super_Transformable);
          sf::Transformable::setPosition
                    (&sprite.super_Transformable,0.0,(float)this->characterSize_ + pVVar4->y + 4.0);
          pVVar4 = sf::Transformable::getPosition(&sprite.super_Transformable);
          fVar11 = pVVar4->x;
          VVar5 = sf::Texture::getSize(pNVar8->texture);
          pVVar4 = sf::Transformable::getPosition(&sprite.super_Transformable);
          fVar1 = pVVar4->y;
          VVar6 = sf::Texture::getSize(pNVar8->texture);
          fVar13 = ((float)iVar7 - fVar11) / (float)((ulong)VVar5 & 0xffffffff);
          fVar11 = ((float)iVar9 - fVar1) / (float)((ulong)VVar6 >> 0x20);
          if (fVar13 <= fVar11) {
            fVar11 = fVar13;
          }
          sf::Transformable::setScale(&sprite.super_Transformable,fVar11,fVar11);
          sf::RenderTarget::draw(target,&sprite.super_Drawable,&states);
          sf::Transformable::~Transformable(&sprite.super_Transformable);
        }
      }
      sf::RenderTarget::draw
                (target,&((this->fields_).super__Vector_base<sf::Text,_std::allocator<sf::Text>_>.
                          _M_impl.super__Vector_impl_data._M_start)->super_Drawable,&states);
      sf::RenderTarget::draw(target,&textureField.super_Drawable,&states);
      sf::Text::~Text(&textureField);
    }
    else if (this->mode_ == def) {
      pTVar2 = (this->fields_).super__Vector_base<sf::Text,_std::allocator<sf::Text>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (drawable = (this->fields_).super__Vector_base<sf::Text,_std::allocator<sf::Text>_>.
                      _M_impl.super__Vector_impl_data._M_start; drawable != pTVar2;
          drawable = drawable + 1) {
        sf::RenderTarget::draw(target,&drawable->super_Drawable,&states);
      }
      p_Var10 = &(this->customFields_)._M_h._M_before_begin;
      while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
        sf::RenderTarget::draw(target,(Drawable *)(p_Var10 + 5),&states);
      }
    }
  }
  return;
}

Assistant:

void DebugScreen::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!visible_) {
        return;
    }

    sf::Vector2i clippedSize = {
        std::max(static_cast<int>(windowSize_.x) - borderTopLeft_.x - borderBottomRight_.x, 0),
        std::max(static_cast<int>(windowSize_.y) - borderTopLeft_.y - borderBottomRight_.y, 0),
    };
    states.transform.translate(static_cast<sf::Vector2f>(borderTopLeft_));

    if (mode_ == Mode::def) {
        for (const auto& field : fields_) {
            target.draw(field, states);
        }
        for (const auto& custom : customFields_) {
            target.draw(custom.second, states);
        }
    } else if (mode_ == Mode::textures) {
        sf::Text textureField("Texture: none", font_, characterSize_);
        textureField.setPosition(fields_[0].getPosition() + sf::Vector2f(0.0f, 1.0f * characterSize_));
        if (modeStates_[static_cast<int>(mode_)] >= 0 && modeStates_[static_cast<int>(mode_)] < static_cast<int>(textures_.size())) {
            const NamedTexture& namedTex = textures_[modeStates_[static_cast<int>(mode_)]];
            textureField.setString("Texture: " + namedTex.name + " (size " + std::to_string(namedTex.texture->getSize().x) + " by " + std::to_string(namedTex.texture->getSize().y) + ")");

            sf::Sprite sprite(*namedTex.texture);
            sprite.setPosition(0.0f, textureField.getPosition().y + 1.0f * characterSize_ + 4.0f);
            float scaleX = (clippedSize.x - sprite.getPosition().x) / namedTex.texture->getSize().x;
            float scaleY = (clippedSize.y - sprite.getPosition().y) / namedTex.texture->getSize().y;
            float scale = std::min(scaleX, scaleY);
            sprite.setScale(scale, scale);
            target.draw(sprite, states);
        }

        target.draw(fields_[0], states);
        target.draw(textureField, states);
    }
}